

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

int sftp_statvfs(LIBSSH2_SFTP *sftp,char *path,uint path_len,LIBSSH2_SFTP_STATVFS *st)

{
  int iVar1;
  uint32_t uVar2;
  ssize_t sVar3;
  list_node *plVar4;
  list_head *plVar5;
  uchar *puVar6;
  libssh2_uint64_t lVar7;
  char *pcVar8;
  libssh2_uint64_t lVar9;
  uint32_t retcode;
  uint flag;
  ssize_t rc;
  uchar *data;
  uchar *s;
  uchar *packet;
  ulong uStack_48;
  uint32_t packet_len;
  size_t data_len;
  LIBSSH2_SESSION *session;
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SFTP_STATVFS *st_local;
  char *pcStack_20;
  uint path_len_local;
  char *path_local;
  LIBSSH2_SFTP *sftp_local;
  
  session = (LIBSSH2_SESSION *)sftp->channel;
  data_len = (size_t)session->kex_prefs;
  uStack_48 = 0;
  packet._4_4_ = path_len + 0x24;
  rc = 0;
  channel = (LIBSSH2_CHANNEL *)st;
  st_local._4_4_ = path_len;
  pcStack_20 = path;
  path_local = (char *)sftp;
  if (sftp->statvfs_state == libssh2_NB_state_idle) {
    sftp->last_errno = 0;
    data = (uchar *)(*((LIBSSH2_SESSION *)data_len)->alloc)((size_t)packet._4_4_,(void **)data_len);
    s = data;
    if (data == (uchar *)0x0) {
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)data_len,-6,
                             "Unable to allocate memory for FXP_EXTENDED packet");
      return iVar1;
    }
    _libssh2_store_u32(&data,packet._4_4_ - 4);
    *data = 200;
    iVar1 = *(int *)(path_local + 8);
    *(int *)(path_local + 8) = iVar1 + 1;
    *(int *)(path_local + 0x128) = iVar1;
    data = data + 1;
    _libssh2_store_u32(&data,*(uint32_t *)(path_local + 0x128));
    _libssh2_store_str(&data,"statvfs@openssh.com",0x13);
    _libssh2_store_str(&data,pcStack_20,(ulong)st_local._4_4_);
    path_local[0x11c] = '\x02';
    path_local[0x11d] = '\0';
    path_local[0x11e] = '\0';
    path_local[0x11f] = '\0';
  }
  else {
    s = sftp->statvfs_packet;
  }
  if (*(int *)(path_local + 0x11c) == 2) {
    sVar3 = _libssh2_channel_write((LIBSSH2_CHANNEL *)session,0,s,(ulong)packet._4_4_);
    if ((sVar3 == -0x25) || ((-1 < sVar3 && (sVar3 < (long)(ulong)packet._4_4_)))) {
      *(uchar **)(path_local + 0x120) = s;
      return -0x25;
    }
    (**(code **)(data_len + 0x18))(s,data_len);
    path_local[0x120] = '\0';
    path_local[0x121] = '\0';
    path_local[0x122] = '\0';
    path_local[0x123] = '\0';
    path_local[0x124] = '\0';
    path_local[0x125] = '\0';
    path_local[0x126] = '\0';
    path_local[0x127] = '\0';
    if (sVar3 < 0) {
      path_local[0x11c] = '\0';
      path_local[0x11d] = '\0';
      path_local[0x11e] = '\0';
      path_local[0x11f] = '\0';
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)data_len,-7,"_libssh2_channel_write() failed");
      return iVar1;
    }
    path_local[0x11c] = '\x03';
    path_local[0x11d] = '\0';
    path_local[0x11e] = '\0';
    path_local[0x11f] = '\0';
  }
  iVar1 = sftp_packet_requirev
                    ((LIBSSH2_SFTP *)path_local,2,sftp_statvfs::responses,
                     *(uint32_t *)(path_local + 0x128),(uchar **)&rc,&stack0xffffffffffffffb8,9);
  if (iVar1 == -0x25) {
    sftp_local._4_4_ = -0x25;
  }
  else if (iVar1 == -0x26) {
    if (uStack_48 != 0) {
      (**(code **)(data_len + 0x18))(rc,data_len);
    }
    sftp_local._4_4_ =
         _libssh2_error((LIBSSH2_SESSION *)data_len,-0x1f,"SFTP fstat packet too short");
  }
  else if (iVar1 == 0) {
    if (*(char *)rc == 'e') {
      uVar2 = _libssh2_ntohu32((uchar *)(rc + 5));
      path_local[0x11c] = '\0';
      path_local[0x11d] = '\0';
      path_local[0x11e] = '\0';
      path_local[0x11f] = '\0';
      (**(code **)(data_len + 0x18))(rc,data_len);
      *(uint32_t *)(path_local + 0x48) = uVar2;
      sftp_local._4_4_ = _libssh2_error((LIBSSH2_SESSION *)data_len,-0x1f,"SFTP Protocol Error");
    }
    else if (uStack_48 < 0x5d) {
      (**(code **)(data_len + 0x18))(rc,data_len);
      path_local[0x11c] = '\0';
      path_local[0x11d] = '\0';
      path_local[0x11e] = '\0';
      path_local[0x11f] = '\0';
      sftp_local._4_4_ =
           _libssh2_error((LIBSSH2_SESSION *)data_len,-0x1f,"SFTP Protocol Error: short response");
    }
    else {
      path_local[0x11c] = '\0';
      path_local[0x11d] = '\0';
      path_local[0x11e] = '\0';
      path_local[0x11f] = '\0';
      plVar4 = (list_node *)_libssh2_ntohu64((uchar *)(rc + 5));
      (channel->node).next = plVar4;
      plVar4 = (list_node *)_libssh2_ntohu64((uchar *)(rc + 0xd));
      (channel->node).prev = plVar4;
      plVar5 = (list_head *)_libssh2_ntohu64((uchar *)(rc + 0x15));
      (channel->node).head = plVar5;
      puVar6 = (uchar *)_libssh2_ntohu64((uchar *)(rc + 0x1d));
      channel->channel_type = puVar6;
      lVar7 = _libssh2_ntohu64((uchar *)(rc + 0x25));
      channel->channel_type_len = lVar7;
      lVar7 = _libssh2_ntohu64((uchar *)(rc + 0x2d));
      *(libssh2_uint64_t *)&channel->exit_status = lVar7;
      pcVar8 = (char *)_libssh2_ntohu64((uchar *)(rc + 0x35));
      channel->exit_signal = pcVar8;
      lVar7 = _libssh2_ntohu64((uchar *)(rc + 0x3d));
      (channel->local).id = (int)lVar7;
      (channel->local).window_size_initial = (int)(lVar7 >> 0x20);
      lVar7 = _libssh2_ntohu64((uchar *)(rc + 0x45));
      (channel->local).window_size = (int)lVar7;
      (channel->local).packet_size = (int)(lVar7 >> 0x20);
      lVar7 = _libssh2_ntohu64((uchar *)(rc + 0x4d));
      lVar9 = _libssh2_ntohu64((uchar *)(rc + 0x55));
      (channel->remote).window_size_initial = (int)lVar9;
      (channel->remote).window_size = (int)(lVar9 >> 0x20);
      *(long *)&(channel->local).close = (long)(int)(uint)((lVar7 & 1) != 0);
      iVar1 = 0;
      if ((lVar7 & 2) != 0) {
        iVar1 = 2;
      }
      *(ulong *)&(channel->local).close = (long)iVar1 | *(ulong *)&(channel->local).close;
      (**(code **)(data_len + 0x18))(rc,data_len);
      sftp_local._4_4_ = 0;
    }
  }
  else {
    path_local[0x11c] = '\0';
    path_local[0x11d] = '\0';
    path_local[0x11e] = '\0';
    path_local[0x11f] = '\0';
    sftp_local._4_4_ =
         _libssh2_error((LIBSSH2_SESSION *)data_len,iVar1,"Error waiting for FXP EXTENDED REPLY");
  }
  return sftp_local._4_4_;
}

Assistant:

static int sftp_statvfs(LIBSSH2_SFTP *sftp, const char *path,
                        unsigned int path_len, LIBSSH2_SFTP_STATVFS *st)
{
    LIBSSH2_CHANNEL *channel = sftp->channel;
    LIBSSH2_SESSION *session = channel->session;
    size_t data_len = 0;
    /* 17 = packet_len(4) + packet_type(1) + request_id(4) + ext_len(4)
       + path_len (4) */
    /* 19 = strlen ("statvfs@openssh.com") */
    uint32_t packet_len = path_len + 19 + 17;
    unsigned char *packet, *s, *data = NULL;
    ssize_t rc;
    unsigned int flag;
    static const unsigned char responses[2] =
        { SSH_FXP_EXTENDED_REPLY, SSH_FXP_STATUS };

    if(sftp->statvfs_state == libssh2_NB_state_idle) {
        sftp->last_errno = LIBSSH2_FX_OK;

        _libssh2_debug((session, LIBSSH2_TRACE_SFTP,
                       "Getting file system statistics of %s", path));
        s = packet = LIBSSH2_ALLOC(session, packet_len);
        if(!packet) {
            return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                  "Unable to allocate memory for FXP_EXTENDED "
                                  "packet");
        }

        _libssh2_store_u32(&s, packet_len - 4);
        *(s++) = SSH_FXP_EXTENDED;
        sftp->statvfs_request_id = sftp->request_id++;
        _libssh2_store_u32(&s, sftp->statvfs_request_id);
        _libssh2_store_str(&s, "statvfs@openssh.com", 19);
        _libssh2_store_str(&s, path, path_len);

        sftp->statvfs_state = libssh2_NB_state_created;
    }
    else {
        packet = sftp->statvfs_packet;
    }

    if(sftp->statvfs_state == libssh2_NB_state_created) {
        rc = _libssh2_channel_write(channel, 0, packet, packet_len);
        if(rc == LIBSSH2_ERROR_EAGAIN ||
            (0 <= rc && rc < (ssize_t)packet_len)) {
            sftp->statvfs_packet = packet;
            return LIBSSH2_ERROR_EAGAIN;
        }

        LIBSSH2_FREE(session, packet);
        sftp->statvfs_packet = NULL;

        if(rc < 0) {
            sftp->statvfs_state = libssh2_NB_state_idle;
            return _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                                  "_libssh2_channel_write() failed");
        }
        sftp->statvfs_state = libssh2_NB_state_sent;
    }

    rc = sftp_packet_requirev(sftp, 2, responses, sftp->statvfs_request_id,
                              &data, &data_len, 9);
    if(rc == LIBSSH2_ERROR_EAGAIN) {
        return (int)rc;
    }
    else if(rc == LIBSSH2_ERROR_BUFFER_TOO_SMALL) {
        if(data_len > 0) {
            LIBSSH2_FREE(session, data);
        }
        return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                              "SFTP fstat packet too short");
    }
    else if(rc) {
        sftp->statvfs_state = libssh2_NB_state_idle;
        return _libssh2_error(session, (int)rc,
                              "Error waiting for FXP EXTENDED REPLY");
    }

    if(data[0] == SSH_FXP_STATUS) {
        uint32_t retcode = _libssh2_ntohu32(data + 5);
        sftp->statvfs_state = libssh2_NB_state_idle;
        LIBSSH2_FREE(session, data);
        sftp->last_errno = retcode;
        return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                              "SFTP Protocol Error");
    }

    if(data_len < 93) {
        LIBSSH2_FREE(session, data);
        sftp->statvfs_state = libssh2_NB_state_idle;
        return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                              "SFTP Protocol Error: short response");
    }

    sftp->statvfs_state = libssh2_NB_state_idle;

    st->f_bsize = _libssh2_ntohu64(data + 5);
    st->f_frsize = _libssh2_ntohu64(data + 13);
    st->f_blocks = _libssh2_ntohu64(data + 21);
    st->f_bfree = _libssh2_ntohu64(data + 29);
    st->f_bavail = _libssh2_ntohu64(data + 37);
    st->f_files = _libssh2_ntohu64(data + 45);
    st->f_ffree = _libssh2_ntohu64(data + 53);
    st->f_favail = _libssh2_ntohu64(data + 61);
    st->f_fsid = _libssh2_ntohu64(data + 69);
    flag = (unsigned int)_libssh2_ntohu64(data + 77);
    st->f_namemax = _libssh2_ntohu64(data + 85);

    st->f_flag = (flag & SSH_FXE_STATVFS_ST_RDONLY)
        ? LIBSSH2_SFTP_ST_RDONLY : 0;
    st->f_flag |= (flag & SSH_FXE_STATVFS_ST_NOSUID)
        ? LIBSSH2_SFTP_ST_NOSUID : 0;

    LIBSSH2_FREE(session, data);
    return 0;
}